

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O1

void __thiscall libtorrent::dht_error_alert::~dht_error_alert(dht_error_alert *this)

{
  operator_delete(this,0x28);
  return;
}

Assistant:

struct TORRENT_EXPORT dht_error_alert final : alert
	{
		// internal
		dht_error_alert(aux::stack_allocator& alloc, operation_t op
			, error_code const& ec);

		TORRENT_DEFINE_ALERT(dht_error_alert, 73)

		static constexpr alert_category_t static_category = alert_category::error | alert_category::dht;
		std::string message() const override;

		// the error code
		error_code error;

		// the operation that failed
		operation_t op;

#if TORRENT_ABI_VERSION == 1
		enum op_t
		{
			unknown TORRENT_DEPRECATED_ENUM,
			hostname_lookup TORRENT_DEPRECATED_ENUM
		};

		// the operation that failed
		op_t const TORRENT_DEPRECATED_MEMBER operation;
#endif
	}